

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_shouldSupportConstParameters_Test::
TEST_MockComparatorCopierTest_shouldSupportConstParameters_Test
          (TEST_MockComparatorCopierTest_shouldSupportConstParameters_Test *this)

{
  TEST_MockComparatorCopierTest_shouldSupportConstParameters_Test *this_local;
  
  memset(this,0,8);
  TEST_GROUP_CppUTestGroupMockComparatorCopierTest::TEST_GROUP_CppUTestGroupMockComparatorCopierTest
            (&this->super_TEST_GROUP_CppUTestGroupMockComparatorCopierTest);
  (this->super_TEST_GROUP_CppUTestGroupMockComparatorCopierTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_MockComparatorCopierTest_shouldSupportConstParameters_Test_00331ec8;
  return;
}

Assistant:

TEST(MockComparatorCopierTest, shouldSupportConstParameters)
{
    StubComparator comparator;
    mock().installComparator("SomeClass", comparator);

    SomeClass param;
    mock().expectOneCall("functionWithConstParam").withParameterOfType("SomeClass", "param", &param);
    functionWithConstParam(param);

    mock().checkExpectations();
}